

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

ACCEPTED_HANDLE accepted_create(void)

{
  ACCEPTED_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (ACCEPTED_HANDLE)malloc(8);
  if (__ptr != (ACCEPTED_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x24);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ACCEPTED_HANDLE)0x0;
}

Assistant:

ACCEPTED_HANDLE accepted_create(void)
{
    ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)malloc(sizeof(ACCEPTED_INSTANCE));
    if (accepted_instance != NULL)
    {
        accepted_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(36);
        if (accepted_instance->composite_value == NULL)
        {
            free(accepted_instance);
            accepted_instance = NULL;
        }
    }

    return accepted_instance;
}